

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::initGLFunctions(RenderingContext *this,Functions *gl)

{
  int iVar1;
  int iVar2;
  EGLint majorVersion;
  uint uVar3;
  Functions *in_RDX;
  char *extensions [1];
  char *local_8;
  
  local_8 = "GL_KHR_robustness";
  iVar2 = 0;
  uVar3 = 1;
  do {
    iVar1 = *(int *)&gl->activeShaderProgram;
    do {
      while (iVar1 < 0x30bf) {
        if (iVar1 == 0x3038) {
          EglTestContext::initGLFunctions
                    ((EglTestContext *)this,in_RDX,(ApiType)((iVar2 << 4 | uVar3) & 0x3ff),1,
                     &local_8);
          return;
        }
        if (iVar1 == 0x3098) {
          uVar3 = *(uint *)((long)&gl->activeShaderProgram + 4);
          goto LAB_0021937c;
        }
      }
      if (iVar1 == 0x30bf) break;
      if (iVar1 == 0x30fb) {
        iVar2 = *(int *)((long)&gl->activeShaderProgram + 4);
        break;
      }
    } while (iVar1 != 0x3138);
LAB_0021937c:
    gl = (Functions *)&gl->activeTexture;
  } while( true );
}

Assistant:

void RenderingContext::initGLFunctions (glw::Functions *gl)
{
	const char* extensions[] = { "GL_KHR_robustness" };
	m_eglTestCtx.initGLFunctions(gl, attribListToContextType(m_attribList).getAPI(), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
}